

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnNameEntry
          (BinaryReaderIR *this,NameSectionSubsection type,Index index,string_view name)

{
  Index index_local;
  NameSectionSubsection type_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  switch(type) {
  case First:
  case Function:
  case Local:
  case Label:
    break;
  case Type:
    SetTypeName(this,index,name);
    break;
  case Table:
    SetTableName(this,index,name);
    break;
  case Memory:
    SetMemoryName(this,index,name);
    break;
  case Global:
    SetGlobalName(this,index,name);
    break;
  case ElemSegment:
    SetElemSegmentName(this,index,name);
    break;
  case DataSegment:
    SetDataSegmentName(this,index,name);
    break;
  case Last:
    SetTagName(this,index,name);
  }
  Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnNameEntry(NameSectionSubsection type,
                                   Index index,
                                   std::string_view name) {
  switch (type) {
    // TODO(sbc): remove OnFunctionName in favor of just using
    // OnNameEntry so that this works
    case NameSectionSubsection::Function:
    case NameSectionSubsection::Local:
    case NameSectionSubsection::Module:
    case NameSectionSubsection::Label:
      break;
    case NameSectionSubsection::Type:
      SetTypeName(index, name);
      break;
    case NameSectionSubsection::Tag:
      SetTagName(index, name);
      break;
    case NameSectionSubsection::Global:
      SetGlobalName(index, name);
      break;
    case NameSectionSubsection::Table:
      SetTableName(index, name);
      break;
    case NameSectionSubsection::DataSegment:
      SetDataSegmentName(index, name);
      break;
    case NameSectionSubsection::Memory:
      SetMemoryName(index, name);
      break;
    case NameSectionSubsection::ElemSegment:
      SetElemSegmentName(index, name);
      break;
  }
  return Result::Ok;
}